

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

uint __thiscall
TArray<FStatistics,_FStatistics>::Reserve(TArray<FStatistics,_FStatistics> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  FStatistics *pFVar3;
  ulong uVar4;
  ulong uVar5;
  
  Grow(this,amount);
  uVar2 = this->Count;
  uVar5 = (ulong)uVar2;
  this->Count = amount + uVar2;
  if (uVar2 < amount + uVar2) {
    uVar4 = uVar5 << 5 | 0x18;
    do {
      pFVar3 = this->Array;
      puVar1 = (undefined8 *)((long)pFVar3 + (uVar4 - 0x18));
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pFVar3 + (uVar4 - 8)) = 0x8a502c;
      *(undefined8 *)((long)&(pFVar3->stats).Array + uVar4) = 0x8a502c;
      FString::NullString.RefCount = FString::NullString.RefCount + 2;
      uVar5 = uVar5 + 1;
      uVar4 = uVar4 + 0x20;
    } while (uVar5 < this->Count);
  }
  return uVar2;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}